

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O1

int parse_commandline(int argc,char **argv,oonf_appdata *appdata,_Bool reload_only)

{
  uint uVar1;
  int iVar2;
  cfg_db *db;
  cfg_instance *pcVar3;
  list_entity *plVar4;
  oonf_subsystem *poVar5;
  cfg_db *db_00;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  char *pcVar8;
  list_entity *plVar9;
  bool bVar10;
  int opt_idx;
  autobuf log;
  
  db = oonf_cfg_get_rawdb();
  _optind = 1;
  _opterr = _ignore_unknown - 1;
  abuf_init(&log);
  pcVar8 = "-hvp:ql:S:s:r:g::f:n";
  if ((int)CONCAT71(in_register_00000009,reload_only) != 0) {
    pcVar8 = "-p:l:s:r:f:n";
  }
  uVar1 = getopt_long(argc,argv,pcVar8,oonf_options);
  if ((int)uVar1 < 0) {
    bVar10 = true;
    uVar7 = 0xffffffff;
  }
  else {
    do {
      uVar7 = 0xffffffff;
      if (0xff < (int)uVar1) {
        if (1 < uVar1 - 0x101) {
          if (uVar1 != 0x100) goto switchD_0012d230_caseD_69;
          _schema_name = _optarg;
          _display_schema = 1;
        }
        goto LAB_0012d433;
      }
      switch(uVar1) {
      case 0x67:
        pcVar3 = oonf_cfg_get_instance();
        iVar2 = cfg_cmd_handle_get(pcVar3,db,_optarg,&log);
        uVar7 = (uint)(iVar2 != 0);
        break;
      case 0x68:
        uVar7 = 0;
        abuf_appendf(&log,"Usage: %s [OPTION]...\n%s%s%s",*argv,appdata->help_prefix);
        break;
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x74:
      case 0x75:
switchD_0012d230_caseD_69:
        if ((!reload_only) && (_ignore_unknown == 0)) {
          abuf_appendf(&log,"Unknown parameter: \'%c\' (%d)\n",(ulong)uVar1,(ulong)uVar1);
LAB_0012d42e:
          uVar7 = 1;
        }
        break;
      case 0x6c:
        pcVar3 = oonf_cfg_get_instance();
        iVar2 = cfg_cmd_handle_load(pcVar3,db,_optarg,&log);
        goto LAB_0012d3c6;
      case 0x70:
        poVar5 = oonf_cfg_load_subsystem(_optarg);
        if (poVar5 == (oonf_subsystem *)0x0) goto LAB_0012d42e;
        db_00 = oonf_cfg_get_rawdb();
        cfg_db_set_entry_ext(db_00,"global",(char *)0x0,"plugin",_optarg,true,true);
        break;
      case 0x71:
        oonf_cfg_exit();
        break;
      case 0x72:
        pcVar3 = oonf_cfg_get_instance();
        iVar2 = cfg_cmd_handle_remove(pcVar3,db,_optarg,&log);
        goto LAB_0012d3c6;
      case 0x73:
        pcVar3 = oonf_cfg_get_instance();
        iVar2 = cfg_cmd_handle_set(pcVar3,db,_optarg,&log);
LAB_0012d3c6:
        uVar7 = -(uint)(iVar2 == 0) | 1;
        break;
      case 0x76:
        oonf_log_printversion(&log);
        uVar7 = 0;
        plVar4 = (oonf_plugin_tree.list_head.next)->prev;
        plVar9 = oonf_plugin_tree.list_head.next;
        while (plVar4 != oonf_plugin_tree.list_head.prev) {
          if (plVar9[-1].next == (list_entity *)0x0) {
            abuf_appendf(&log,"Static plugin: %s\n",plVar9[-7].next);
          }
          plVar9 = plVar9->next;
          plVar4 = plVar9->prev;
        }
        break;
      default:
        if (uVar1 != 1) {
          if (uVar1 == 0x53) {
            pcVar3 = oonf_cfg_get_instance();
            iVar2 = cfg_cmd_handle_save(pcVar3,db,_optarg,&log);
            goto LAB_0012d3c6;
          }
          goto switchD_0012d230_caseD_69;
        }
        if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
          (*_handle_unused_argument)(_optarg);
        }
      }
LAB_0012d433:
      bVar10 = uVar7 == 0xffffffff;
    } while ((bVar10) && (uVar1 = getopt_long(argc,argv,pcVar8,oonf_options), -1 < (int)uVar1));
  }
  for (; (bool)(_optind < argc & bVar10); _optind = _optind + 1) {
    if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
      (*_handle_unused_argument)(argv[_optind]);
    }
  }
  if (log._len != 0) {
    if (reload_only) {
      if ((log_global_mask[1] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x26b,(void *)0x0,0,
                 "Cannot reload configuration.\n%s",log._buf);
      }
    }
    else {
      if (uVar7 == 0) {
        puVar6 = (undefined8 *)&stdout;
      }
      else {
        puVar6 = (undefined8 *)&stderr;
      }
      fputs(log._buf,(FILE *)*puVar6);
    }
  }
  abuf_free(&log);
  return uVar7;
}

Assistant:

static int
parse_commandline(int argc, char **argv, const struct oonf_appdata *appdata __attribute((unused)), bool reload_only) {
  struct oonf_subsystem *plugin;
  const char *parameters;
  struct autobuf log;
  struct cfg_db *db;
  int opt, opt_idx, return_code;

  return_code = -1;
  db = oonf_cfg_get_rawdb();

  /* reset getopt_long */
  opt_idx = -1;
  optind = 1;
  opterr = _ignore_unknown ? 0 : -1;

  abuf_init(&log);

  if (reload_only) {
    /* only parameters that load and change configuration data */
    parameters = "-p:l:s:r:f:n";
  }
  else {
    parameters = "-hvp:ql:S:s:r:g::f:n";
  }

  while (return_code == -1 && 0 <= (opt = getopt_long(argc, argv, parameters, oonf_options, &opt_idx))) {
    switch (opt) {
      case 'h':
#if !defined(REMOVE_HELPTEXT)
        abuf_appendf(
          &log, "Usage: %s [OPTION]...\n%s%s%s", argv[0], appdata->help_prefix, help_text, appdata->help_suffix);
#endif
        return_code = 0;
        break;

      case argv_option_debug_early:
      case argv_option_ignore_unknown:
        /* ignore this here */
        break;

      case 'v':
        oonf_log_printversion(&log);
        avl_for_each_element(&oonf_plugin_tree, plugin, _node) {
          if (!oonf_subsystem_is_dynamic(plugin)) {
            abuf_appendf(&log, "Static plugin: %s\n", plugin->name);
          }
        }
        return_code = 0;
        break;
      case 'p':
        if (oonf_cfg_load_subsystem(optarg) == NULL) {
          return_code = 1;
        }
        else {
          cfg_db_add_entry(oonf_cfg_get_rawdb(), CFG_SECTION_GLOBAL, NULL, CFG_GLOBAL_PLUGIN, optarg);
        }
        break;
      case 'q':
        oonf_cfg_exit();
        break;

      case argv_option_schema:
        _schema_name = optarg;
        _display_schema = true;
        break;

      case 'l':
        if (cfg_cmd_handle_load(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'S':
        if (cfg_cmd_handle_save(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 's':
        if (cfg_cmd_handle_set(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'r':
        if (cfg_cmd_handle_remove(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'g':
        if (cfg_cmd_handle_get(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        else {
          return_code = 0;
        }
        break;
      case 1:
        /* string that is not part of an option */
        if (_handle_unused_argument) {
          _handle_unused_argument(optarg);
        }
        break;

      case '?':
      default:
        if (!(reload_only || _ignore_unknown)) {
          abuf_appendf(&log, "Unknown parameter: '%c' (%d)\n", opt, opt);
          return_code = 1;
        }
        break;
    }
  }

  while (return_code == -1 && optind < argc) {
    /* handle the end of the command line */
    if (_handle_unused_argument) {
      _handle_unused_argument(argv[optind]);
    }
    optind++;
  }

  if (abuf_getlen(&log) > 0) {
    if (reload_only) {
      OONF_WARN(LOG_MAIN, "Cannot reload configuration.\n%s", abuf_getptr(&log));
    }
    else {
      fputs(abuf_getptr(&log), return_code == 0 ? stdout : stderr);
    }
  }

  abuf_free(&log);

  return return_code;
}